

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::CheckCoapResponseCode
                  (Error *__return_storage_ptr__,Response *aResponse)

{
  char *begin;
  char *pcVar1;
  Code aCode;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string local_f0;
  string local_d0;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  if ((aResponse->mHeader).mCode != 'D') {
    local_68.types_[0] = string_type;
    local_68.types_[1] = string_type;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "request for {} failed: {}";
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x19;
    local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_68.context_.super_basic_format_parse_context<char>._20_4_ = 2;
    local_68.parse_funcs_[0] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    local_68.parse_funcs_[1] =
         ::fmt::v10::detail::
         parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>;
    pcVar1 = "request for {} failed: {}";
    local_68.context_.types_ = local_68.types_;
    while (begin = pcVar1, begin != "") {
      pcVar1 = begin + 1;
      if (*begin == '}') {
        if ((pcVar1 == "") || (*pcVar1 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar1 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar1 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                           (begin,"",&local_68);
      }
    }
    coap::Message::GetRequestUri_abi_cxx11_(&local_d0,aResponse);
    coap::CodeToString_abi_cxx11_(&local_f0,(coap *)(ulong)(aResponse->mHeader).mCode,aCode);
    local_68.types_ = (type  [2])local_d0._M_dataplus._M_p;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         (char *)local_d0._M_string_length;
    local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ =
         (size_t)local_f0._M_dataplus._M_p;
    local_68.context_.super_basic_format_parse_context<char>._16_8_ = local_f0._M_string_length;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x19;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_68;
    ::fmt::v10::vformat_abi_cxx11_(&local_b0,(v10 *)"request for {} failed: {}",fmt,args);
    local_90._0_4_ = kCoapError;
    std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
    Error::operator=(__return_storage_ptr__,(Error *)local_90);
    std::__cxx11::string::~string((string *)(local_90 + 8));
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::CheckCoapResponseCode(const coap::Response &aResponse)
{
    Error error = ERROR_NONE;

    VerifyOrExit(aResponse.GetCode() == coap::Code::kChanged,
                 error = ERROR_COAP_ERROR("request for {} failed: {}", aResponse.GetRequestUri(),
                                          coap::CodeToString(aResponse.GetCode())));

exit:
    return error;
}